

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseConnection.cpp
# Opt level: O3

void __thiscall
tonk::HostnameResolverState::InitializeResolvedAddressList
          (HostnameResolverState *this,results_type *results)

{
  undefined8 *puVar1;
  pointer paVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  long lVar4;
  uint uVar5;
  uint64_t uVar6;
  byte bVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  bool bVar11;
  address local_50;
  
  paVar2 = (this->ResolvedIPAddresses).
           super__Vector_base<asio::ip::address,_std::allocator<asio::ip::address>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->ResolvedIPAddresses).
      super__Vector_base<asio::ip::address,_std::allocator<asio::ip::address>_>._M_impl.
      super__Vector_impl_data._M_finish != paVar2) {
    (this->ResolvedIPAddresses).
    super__Vector_base<asio::ip::address,_std::allocator<asio::ip::address>_>._M_impl.
    super__Vector_impl_data._M_finish = paVar2;
  }
  peVar3 = (results->super_basic_resolver_iterator<asio::ip::tcp>).values_.
           super___shared_ptr<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  std::vector<asio::ip::address,_std::allocator<asio::ip::address>_>::reserve
            (&this->ResolvedIPAddresses,
             ((long)*(pointer *)
                     ((long)&(peVar3->
                             super__Vector_base<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>
                             )._M_impl.super__Vector_impl_data + 8) -
              *(long *)&(peVar3->
                        super__Vector_base<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>
                        )._M_impl.super__Vector_impl_data >> 5) * -0x5555555555555555);
  peVar3 = (results->super_basic_resolver_iterator<asio::ip::tcp>).values_.
           super___shared_ptr<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  this_00 = (results->super_basic_resolver_iterator<asio::ip::tcp>).values_.
            super___shared_ptr<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  if (peVar3 != (element_type *)0x0) {
    lVar9 = 0;
    lVar10 = 0;
    do {
      lVar4 = *(long *)&(peVar3->
                        super__Vector_base<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>
                        )._M_impl.super__Vector_impl_data;
      bVar11 = *(short *)(lVar4 + lVar9) != 2;
      if (bVar11) {
        puVar1 = (undefined8 *)(lVar4 + 8 + lVar9);
        local_50.ipv6_address_.addr_.__in6_u._0_8_ = *puVar1;
        local_50.ipv6_address_.addr_.__in6_u._8_8_ = puVar1[1];
        local_50.ipv6_address_.scope_id_ = (unsigned_long)*(uint *)(lVar4 + 0x18 + lVar9);
        local_50.ipv4_address_.addr_.s_addr = (in4_addr_type)0;
      }
      else {
        local_50.ipv4_address_.addr_.s_addr = *(in4_addr_type *)(lVar4 + 4 + lVar9);
        local_50.ipv6_address_.scope_id_ = 0;
        local_50.ipv6_address_.addr_.__in6_u._0_8_ = 0;
        local_50.ipv6_address_.addr_.__in6_u._8_8_ = 0;
      }
      local_50.type_ = (anon_enum_32)bVar11;
      std::vector<asio::ip::address,_std::allocator<asio::ip::address>_>::
      emplace_back<asio::ip::address>(&this->ResolvedIPAddresses,&local_50);
      lVar10 = lVar10 + 1;
      lVar9 = lVar9 + 0x60;
    } while (lVar10 != ((long)*(pointer *)
                               ((long)&(peVar3->
                                       super__Vector_base<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>
                                       )._M_impl.super__Vector_impl_data + 8) -
                        *(long *)&(peVar3->
                                  super__Vector_base<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>
                                  )._M_impl.super__Vector_impl_data >> 5) * -0x5555555555555555);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  this->ConnectRequestsRemaining =
       (uint)((ulong)((long)(this->ResolvedIPAddresses).
                            super__Vector_base<asio::ip::address,_std::allocator<asio::ip::address>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->ResolvedIPAddresses).
                           super__Vector_base<asio::ip::address,_std::allocator<asio::ip::address>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 5);
  uVar6 = siamese::GetTimeUsec();
  uVar8 = uVar6 * -0x4f5c17a566d501a4 + 0x5851f42d4c957f2e;
  uVar5 = (uint)(uVar8 >> 0x2d) ^ (uint)(uVar8 >> 0x1b);
  bVar7 = (byte)(uVar8 >> 0x3b);
  this->ConnectAddrIndex = (uVar5 >> bVar7 | uVar5 << 0x20 - bVar7) % this->ConnectRequestsRemaining
  ;
  return;
}

Assistant:

void HostnameResolverState::InitializeResolvedAddressList(
    const asio::ip::tcp::resolver::results_type& results)
{
    // Copy the resolved addresses
    ResolvedIPAddresses.clear();
    ResolvedIPAddresses.reserve(results.size());
    for (const auto& result : results) {
        ResolvedIPAddresses.emplace_back(result.endpoint().address());
    }
    ConnectRequestsRemaining = (unsigned)ResolvedIPAddresses.size();

    // Select the first address to connect to at random
    siamese::PCGRandom prng;
    prng.Seed(siamese::GetTimeUsec());
    ConnectAddrIndex = static_cast<int>(prng.Next() % ConnectRequestsRemaining);
}